

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void google::protobuf::compiler::js::anon_unknown_0::DepthFirstSearch
               (FileDescriptor *file,
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *list,set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *seen)

{
  pointer *pppFVar1;
  iterator __position;
  FileDescriptor *file_00;
  int index;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar2;
  FileDescriptor *local_20;
  
  local_20 = file;
  pVar2 = std::
          _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                    ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)seen,&local_20);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (0 < *(int *)(local_20 + 0x20)) {
      index = 0;
      do {
        file_00 = FileDescriptor::dependency(local_20,index);
        DepthFirstSearch(file_00,list,seen);
        index = index + 1;
      } while (index < *(int *)(local_20 + 0x20));
    }
    __position._M_current =
         (list->
         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (list->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FileDescriptor_const*const&>
                ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
                  *)list,__position,&local_20);
    }
    else {
      *__position._M_current = local_20;
      pppFVar1 = &(list->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
  }
  return;
}

Assistant:

void DepthFirstSearch(const FileDescriptor* file,
                      std::vector<const FileDescriptor*>* list,
                      std::set<const FileDescriptor*>* seen) {
  if (!seen->insert(file).second) {
    return;
  }

  // Add all dependencies.
  for (int i = 0; i < file->dependency_count(); i++) {
    DepthFirstSearch(file->dependency(i), list, seen);
  }

  // Add this file.
  list->push_back(file);
}